

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClear
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Type TVar6;
  LogMessage *pLVar7;
  FieldGenerator *pFVar8;
  long *plVar9;
  pointer ppFVar10;
  Descriptor *pDVar11;
  uint uVar12;
  int extraout_EDX;
  uint i;
  FieldDescriptor *pFVar13;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *field_00;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  FieldDescriptor *extraout_RDX_09;
  FieldDescriptor *extraout_RDX_10;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  string first_field_name;
  string last_field_name;
  uint local_1ec;
  int local_1e8;
  int local_1e0;
  int local_1dc;
  string local_1d8;
  uint local_1b4;
  FieldGeneratorMap *local_1b0;
  int local_1a4;
  string local_1a0;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  uint uVar5;
  
  io::Printer::Print(printer,
                     "void $classname$::Clear() {\n// @@protoc_insertion_point(message_clear_start:$full_name$)\n"
                     ,"classname",&this->classname_,"full_name",*(string **)(this->descriptor_ + 8))
  ;
  io::Printer::Indent(printer);
  if (0 < *(int *)(this->descriptor_ + 0x68)) {
    io::Printer::Print(printer,"_extensions_.Clear();\n");
  }
  if ((this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_1b0 = &this->field_generators_;
    pFVar13 = (FieldDescriptor *)0x0;
    iVar18 = -1;
    do {
      iVar4 = (int)pFVar13;
      if (iVar4 == iVar18) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xa49);
        pLVar7 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (i) != (last_i): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_1d8,pLVar7);
        internal::LogMessage::~LogMessage(&local_68);
      }
      uVar19 = (ulong)iVar4;
      ppFVar10 = (this->optimized_order_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_1a4 = iVar4;
      if (uVar19 < (ulong)((long)(this->optimized_order_).
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10 >> 3))
      {
        do {
          pFVar13 = ppFVar10[uVar19];
          pFVar8 = FieldGeneratorMap::get(local_1b0,pFVar13);
          if (*(int *)(pFVar13 + 0x4c) != 3) break;
          if ((this->use_dependent_base_ == true) && (bVar2 = IsFieldDependent(pFVar13), bVar2)) {
            FieldName_abi_cxx11_(&local_1d8,(cpp *)pFVar13,field);
            io::Printer::Print(printer,"clear_$name$();\n","name",&local_1d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            (*pFVar8->_vptr_FieldGenerator[10])(pFVar8,printer);
          }
          uVar19 = uVar19 + 1;
          ppFVar10 = (this->optimized_order_).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar19 < (ulong)((long)(this->optimized_order_).
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10
                                 >> 3));
        pFVar13 = (FieldDescriptor *)(uVar19 & 0xffffffff);
      }
      uVar19 = (ulong)(int)pFVar13;
      ppFVar10 = (this->optimized_order_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (uVar19 < (ulong)((long)(this->optimized_order_).
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10 >> 3))
      {
        local_1ec = 0;
        iVar18 = -1;
        local_1e8 = -1;
        uVar20 = 0xffffffff;
        local_1dc = -1;
        local_1e0 = -1;
        do {
          pFVar13 = ppFVar10[uVar19];
          bVar3 = anon_unknown_0::CanInitializeByZeroing(pFVar13);
          bVar2 = false;
          uVar12 = 0;
          if (bVar3) {
            if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
              if (pFVar13[0x50] == (FieldDescriptor)0x0) {
                plVar9 = (long *)(*(long *)(pFVar13 + 0x58) + 0x30);
              }
              else if (*(long *)(pFVar13 + 0x68) == 0) {
                plVar9 = (long *)(*(long *)(pFVar13 + 0x30) + 0x98);
              }
              else {
                plVar9 = (long *)(*(long *)(pFVar13 + 0x68) + 0x80);
              }
              uVar12 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [(int)((ulong)((long)pFVar13 - *plVar9) >> 3) * 0x3cf3cf3d];
            }
            uVar5 = uVar12 + 7;
            if (-1 < (int)uVar12) {
              uVar5 = uVar12;
            }
            iVar4 = (int)uVar5 >> 3;
            iVar16 = (int)uVar19;
            iVar14 = iVar16;
            if ((iVar18 == -1) ||
               (bVar2 = iVar4 == iVar18, iVar4 = iVar18, iVar14 = local_1e8, bVar2)) {
              local_1e8 = iVar14;
              if (local_1dc == -1) {
                local_1dc = iVar16;
              }
              local_1ec = local_1ec | 1 << (uVar12 & 0x1f);
              bVar2 = true;
              uVar20 = uVar19 & 0xffffffff;
              iVar18 = iVar4;
              local_1e0 = iVar16;
            }
            else {
              bVar2 = false;
            }
          }
          if (!bVar2) break;
          uVar19 = uVar19 + 1;
          ppFVar10 = (this->optimized_order_).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar19 < (ulong)((long)(this->optimized_order_).
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10
                                 >> 3));
        pFVar13 = (FieldDescriptor *)(uVar19 & 0xffffffff);
      }
      else {
        local_1ec = 0;
        local_1e0 = -1;
        local_1dc = -1;
        uVar20 = 0xffffffff;
        local_1e8 = -1;
        iVar18 = -1;
      }
      iVar4 = (int)uVar20;
      uVar19 = (ulong)(int)pFVar13;
      ppFVar10 = (this->optimized_order_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (uVar19 < (ulong)((long)(this->optimized_order_).
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10 >> 3))
      {
        do {
          pFVar13 = ppFVar10[uVar19];
          if (*(int *)(pFVar13 + 0x4c) == 3) {
LAB_0025908c:
            bVar2 = false;
          }
          else {
            bVar3 = anon_unknown_0::CanInitializeByZeroing(pFVar13);
            uVar12 = 0;
            bVar2 = false;
            if (!bVar3) {
              if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
                if (pFVar13[0x50] == (FieldDescriptor)0x0) {
                  plVar9 = (long *)(*(long *)(pFVar13 + 0x58) + 0x30);
                }
                else if (*(long *)(pFVar13 + 0x68) == 0) {
                  plVar9 = (long *)(*(long *)(pFVar13 + 0x30) + 0x98);
                }
                else {
                  plVar9 = (long *)(*(long *)(pFVar13 + 0x68) + 0x80);
                }
                uVar12 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [(int)((ulong)((long)pFVar13 - *plVar9) >> 3) * 0x3cf3cf3d];
              }
              uVar5 = uVar12 + 7;
              if (-1 < (int)uVar12) {
                uVar5 = uVar12;
              }
              iVar4 = (int)uVar5 >> 3;
              iVar14 = (int)uVar19;
              if ((iVar18 != -1) && (iVar4 = iVar18, iVar14 = local_1e8, (int)uVar5 >> 3 != iVar18))
              goto LAB_0025908c;
              local_1e8 = iVar14;
              iVar18 = iVar4;
              local_1ec = local_1ec | 1 << (uVar12 & 0x1f);
              bVar2 = true;
              uVar20 = uVar19 & 0xffffffff;
            }
          }
          iVar4 = (int)uVar20;
          if (!bVar2) break;
          uVar19 = uVar19 + 1;
          ppFVar10 = (this->optimized_order_).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar19 < (ulong)((long)(this->optimized_order_).
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10
                                 >> 3));
        pFVar13 = (FieldDescriptor *)(uVar19 & 0xffffffff);
      }
      if (iVar18 != -1) {
        local_1b4 = (uint)pFVar13;
        if (local_1e8 == -1) {
          internal::LogMessage::LogMessage
                    (&local_a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xa9e);
          pLVar7 = internal::LogMessage::operator<<
                             (&local_a0,"CHECK failed: (-1) != (last_chunk_start): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_1d8,pLVar7);
          internal::LogMessage::~LogMessage(&local_a0);
          pFVar13 = extraout_RDX;
        }
        if (iVar4 == -1) {
          internal::LogMessage::LogMessage
                    (&local_d8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xa9f);
          pLVar7 = internal::LogMessage::operator<<
                             (&local_d8,"CHECK failed: (-1) != (last_chunk_end): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_1d8,pLVar7);
          internal::LogMessage::~LogMessage(&local_d8);
          pFVar13 = extraout_RDX_00;
        }
        if (local_1ec == 0) {
          internal::LogMessage::LogMessage
                    (&local_110,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xaa0);
          pLVar7 = internal::LogMessage::operator<<
                             (&local_110,"CHECK failed: (0) != (last_chunk_mask): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_1d8,pLVar7);
          internal::LogMessage::~LogMessage(&local_110);
          pFVar13 = extraout_RDX_01;
        }
        iVar14 = 0;
        if (local_1ec != 0) {
          uVar19 = (ulong)local_1ec;
          uVar12 = local_1ec;
          do {
            pFVar13 = (FieldDescriptor *)(ulong)(uVar12 & 1);
            iVar14 = iVar14 + (uVar12 & 1);
            uVar19 = uVar19 >> 1;
            bVar2 = 1 < uVar12;
            uVar12 = (uint)uVar19;
          } while (bVar2);
        }
        bVar2 = *(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3;
        bVar3 = local_1e8 != iVar4;
        if (bVar3 && bVar2) {
          if (iVar14 < 2) {
            internal::LogMessage::LogMessage
                      (&local_148,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xaaa);
            pLVar7 = internal::LogMessage::operator<<(&local_148,"CHECK failed: (2) <= (count): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_1d8,pLVar7);
            internal::LogMessage::~LogMessage(&local_148);
            pFVar13 = extraout_RDX_02;
          }
          iVar16 = (int)pFVar13;
          if (8 < iVar14) {
            internal::LogMessage::LogMessage
                      (&local_180,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xaab);
            pLVar7 = internal::LogMessage::operator<<(&local_180,"CHECK failed: (8) >= (count): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_1d8,pLVar7);
            internal::LogMessage::~LogMessage(&local_180);
            iVar16 = extraout_EDX;
          }
          SimpleItoa_abi_cxx11_(&local_1d8,(protobuf *)(ulong)(uint)(iVar18 << 3),iVar16);
          SimpleItoa_abi_cxx11_(&local_1a0,(protobuf *)(ulong)local_1ec,i);
          io::Printer::Print(printer,"if (_has_bits_[$index$ / 32] & $mask$u) {\n","index",
                             &local_1d8,"mask",&local_1a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
          pFVar13 = extraout_RDX_03;
        }
        if (local_1dc != -1) {
          if (local_1dc == local_1e0) {
            pFVar8 = FieldGeneratorMap::get
                               (local_1b0,
                                (this->optimized_order_).
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[local_1dc]);
            (*pFVar8->_vptr_FieldGenerator[10])(pFVar8,printer);
            pFVar13 = extraout_RDX_04;
          }
          else {
            FieldName_abi_cxx11_
                      (&local_1d8,
                       (cpp *)(this->optimized_order_).
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_1dc],pFVar13);
            FieldName_abi_cxx11_
                      (&local_1a0,
                       (cpp *)(this->optimized_order_).
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_1e0],field_00);
            io::Printer::Print(printer,
                               "::memset(&$first$_, 0, reinterpret_cast<char*>(&$last$_) -\n  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n"
                               ,"first",&local_1d8,"last",&local_1a0);
            pFVar13 = extraout_RDX_05;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
              pFVar13 = extraout_RDX_06;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
              pFVar13 = extraout_RDX_07;
            }
          }
          local_1e8 = local_1e0 + 1;
        }
        if (local_1e8 <= iVar4) {
          lVar15 = (long)local_1e8;
          iVar18 = (iVar4 - local_1e8) + 1;
          do {
            this_00 = (this->optimized_order_).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar15];
            FieldName_abi_cxx11_(&local_1d8,(cpp *)this_00,pFVar13);
            pFVar8 = FieldGeneratorMap::get(local_1b0,this_00);
            TVar6 = FieldDescriptor::type(this_00);
            if (((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar6 * 4) == 10) ||
                (TVar6 = FieldDescriptor::type(this_00),
                *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar6 * 4) == 9)) &&
               (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3)) {
              io::Printer::Print(printer,"if (has_$name$()) {\n","name",&local_1d8);
              bVar1 = true;
              io::Printer::Indent(printer);
            }
            else {
              bVar1 = false;
            }
            (*pFVar8->_vptr_FieldGenerator[10])(pFVar8,printer);
            pFVar13 = extraout_RDX_08;
            if (bVar1) {
              io::Printer::Outdent(printer);
              io::Printer::Print(printer,"}\n");
              pFVar13 = extraout_RDX_09;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
              pFVar13 = extraout_RDX_10;
            }
            lVar15 = lVar15 + 1;
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
        }
        pFVar13 = (FieldDescriptor *)(ulong)local_1b4;
        if (bVar3 && bVar2) {
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
          pFVar13 = (FieldDescriptor *)(ulong)local_1b4;
        }
      }
      iVar18 = local_1a4;
    } while ((ulong)(long)(int)pFVar13 <
             (ulong)((long)(this->optimized_order_).
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->optimized_order_).
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pDVar11 = this->descriptor_;
  if (0 < *(int *)(pDVar11 + 0x38)) {
    lVar17 = 0;
    lVar15 = 0;
    do {
      io::Printer::Print(printer,"clear_$oneof_name$();\n","oneof_name",
                         *(string **)(*(long *)(pDVar11 + 0x40) + lVar17));
      lVar15 = lVar15 + 1;
      pDVar11 = this->descriptor_;
      lVar17 = lVar17 + 0x30;
    } while (lVar15 < *(int *)(pDVar11 + 0x38));
  }
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(printer,"_weak_field_map_.ClearAll();\n");
  }
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
    io::Printer::Print(printer,"_has_bits_.Clear();\n");
  }
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
    io::Printer::Print(printer,"_internal_metadata_.Clear();\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateClear(io::Printer* printer) {
  printer->Print(
      "void $classname$::Clear() {\n"
      "// @@protoc_insertion_point(message_clear_start:$full_name$)\n",
      "classname", classname_, "full_name", descriptor_->full_name());
  printer->Indent();

  // Step 1: Extensions
  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.Clear();\n");
  }

  int last_i = -1;
  for (int i = 0; i < optimized_order_.size(); ) {
    // Detect infinite loops.
    GOOGLE_CHECK_NE(i, last_i);
    last_i = i;

    // Step 2: Repeated fields don't use _has_bits_; emit code to clear them
    // here.
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      const FieldGenerator& generator = field_generators_.get(field);

      if (!field->is_repeated()) {
        break;
      }

      if (use_dependent_base_ && IsFieldDependent(field)) {
        printer->Print("clear_$name$();\n", "name", FieldName(field));
      } else {
        generator.GenerateMessageClearingCode(printer);
      }
    }

    // Step 3: Greedily seek runs of fields that can be cleared by
    // memset-to-0.
    int last_chunk = -1;
    int last_chunk_start = -1;
    int last_chunk_end = -1;
    uint32 last_chunk_mask = 0;

    int memset_run_start = -1;
    int memset_run_end = -1;
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];

      if (!CanInitializeByZeroing(field)) {
        break;
      }

      // "index" defines where in the _has_bits_ the field appears.
      // "i" is our loop counter within optimized_order_.
      int index = HasFieldPresence(descriptor_->file()) ?
          has_bit_indices_[field->index()] : 0;
      int chunk = index / 8;

      if (last_chunk == -1) {
        last_chunk = chunk;
        last_chunk_start = i;
      } else if (chunk != last_chunk) {
        // Emit the fields for this chunk so far.
        break;
      }

      if (memset_run_start == -1) {
        memset_run_start = i;
      }

      memset_run_end = i;
      last_chunk_end = i;
      last_chunk_mask |= static_cast<uint32>(1) << (index % 32);
    }

    // Step 4: Non-repeated, non-zero initializable fields.
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (field->is_repeated() || CanInitializeByZeroing(field)) {
        break;
      }

      // "index" defines where in the _has_bits_ the field appears.
      // "i" is our loop counter within optimized_order_.
      int index = HasFieldPresence(descriptor_->file()) ?
          has_bit_indices_[field->index()] : 0;
      int chunk = index / 8;

      if (last_chunk == -1) {
        last_chunk = chunk;
        last_chunk_start = i;
      } else if (chunk != last_chunk) {
        // Emit the fields for this chunk so far.
        break;
      }

      last_chunk_end = i;
      last_chunk_mask |= static_cast<uint32>(1) << (index % 32);
    }

    if (last_chunk != -1) {
      GOOGLE_DCHECK_NE(-1, last_chunk_start);
      GOOGLE_DCHECK_NE(-1, last_chunk_end);
      GOOGLE_DCHECK_NE(0, last_chunk_mask);

      const int count = popcnt(last_chunk_mask);
      const bool have_outer_if = HasFieldPresence(descriptor_->file()) &&
          (last_chunk_start != last_chunk_end);

      if (have_outer_if) {
        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        GOOGLE_DCHECK_LE(2, count);
        GOOGLE_DCHECK_GE(8, count);

        printer->Print(
          "if (_has_bits_[$index$ / 32] & $mask$u) {\n",
          "index", SimpleItoa(last_chunk * 8),
          "mask", SimpleItoa(last_chunk_mask));
        printer->Indent();
      }

      if (memset_run_start != -1) {
        if (memset_run_start == memset_run_end) {
          // For clarity, do not memset a single field.
          const FieldGenerator& generator =
              field_generators_.get(optimized_order_[memset_run_start]);
          generator.GenerateMessageClearingCode(printer);
        } else {
          const string first_field_name =
              FieldName(optimized_order_[memset_run_start]);
          const string last_field_name =
              FieldName(optimized_order_[memset_run_end]);

          printer->Print(
            "::memset(&$first$_, 0, reinterpret_cast<char*>(&$last$_) -\n"
            "  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n",
            "first", first_field_name,
            "last", last_field_name);
        }

        // Advance last_chunk_start to skip over the fields we zeroed/memset.
        last_chunk_start = memset_run_end + 1;
      }

      // Go back and emit clears for each of the fields we processed.
      for (int j = last_chunk_start; j <= last_chunk_end; j++) {
        const FieldDescriptor* field = optimized_order_[j];
        const string fieldname = FieldName(field);
        const FieldGenerator& generator = field_generators_.get(field);

        // It's faster to just overwrite primitive types, but we should only
        // clear strings and messages if they were set.
        //
        // TODO(kenton):  Let the CppFieldGenerator decide this somehow.
        bool should_check_bit =
          field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
          field->cpp_type() == FieldDescriptor::CPPTYPE_STRING;

        bool have_enclosing_if = false;
        if (should_check_bit &&
            // If no field presence, then always clear strings/messages as well.
            HasFieldPresence(descriptor_->file())) {
          printer->Print("if (has_$name$()) {\n", "name", fieldname);
          printer->Indent();
          have_enclosing_if = true;
        }

        generator.GenerateMessageClearingCode(printer);

        if (have_enclosing_if) {
          printer->Outdent();
          printer->Print("}\n");
        }
      }

      if (have_outer_if) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Step 4: Unions.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
        "clear_$oneof_name$();\n",
        "oneof_name", descriptor_->oneof_decl(i)->name());
  }

  if (num_weak_fields_) {
    printer->Print("_weak_field_map_.ClearAll();\n");
  }

  if (HasFieldPresence(descriptor_->file())) {
    // Step 5: Everything else.
    printer->Print("_has_bits_.Clear();\n");
  }

  if (PreserveUnknownFields(descriptor_)) {
    printer->Print("_internal_metadata_.Clear();\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}